

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QNetworkAddressEntry>::emplace<QNetworkAddressEntry_const&>
          (QMovableArrayOps<QNetworkAddressEntry> *this,qsizetype i,QNetworkAddressEntry *args)

{
  QNetworkAddressEntry **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QNetworkAddressEntry tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QNetworkAddressEntry>).
           super_QArrayDataPointer<QNetworkAddressEntry>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QNetworkAddressEntry>).
        super_QArrayDataPointer<QNetworkAddressEntry>.size == i) {
      qVar5 = QArrayDataPointer<QNetworkAddressEntry>::freeSpaceAtEnd
                        ((QArrayDataPointer<QNetworkAddressEntry> *)this);
      if (qVar5 == 0) goto LAB_002191b2;
      QNetworkAddressEntry::QNetworkAddressEntry
                ((this->super_QGenericArrayOps<QNetworkAddressEntry>).
                 super_QArrayDataPointer<QNetworkAddressEntry>.ptr +
                 (this->super_QGenericArrayOps<QNetworkAddressEntry>).
                 super_QArrayDataPointer<QNetworkAddressEntry>.size,args);
LAB_00219297:
      pqVar2 = &(this->super_QGenericArrayOps<QNetworkAddressEntry>).
                super_QArrayDataPointer<QNetworkAddressEntry>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00219256;
    }
LAB_002191b2:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QNetworkAddressEntry>::freeSpaceAtBegin
                        ((QArrayDataPointer<QNetworkAddressEntry> *)this);
      if (qVar5 != 0) {
        QNetworkAddressEntry::QNetworkAddressEntry
                  ((this->super_QGenericArrayOps<QNetworkAddressEntry>).
                   super_QArrayDataPointer<QNetworkAddressEntry>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QNetworkAddressEntry>).
                   super_QArrayDataPointer<QNetworkAddressEntry>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00219297;
      }
    }
  }
  tmp.d._M_t.
  super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
  .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl =
       (unique_ptr<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QNetworkAddressEntry::QNetworkAddressEntry(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QNetworkAddressEntry>).
          super_QArrayDataPointer<QNetworkAddressEntry>.size != 0;
  QArrayDataPointer<QNetworkAddressEntry>::detachAndGrow
            ((QArrayDataPointer<QNetworkAddressEntry> *)this,(uint)(i == 0 && bVar6),1,
             (QNetworkAddressEntry **)0x0,(QArrayDataPointer<QNetworkAddressEntry> *)0x0);
  if (i == 0 && bVar6) {
    QNetworkAddressEntry::QNetworkAddressEntry
              ((this->super_QGenericArrayOps<QNetworkAddressEntry>).
               super_QArrayDataPointer<QNetworkAddressEntry>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QNetworkAddressEntry>).
               super_QArrayDataPointer<QNetworkAddressEntry>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QNetworkAddressEntry>).
              super_QArrayDataPointer<QNetworkAddressEntry>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QNetworkAddressEntry> *)this,i,1);
    QNetworkAddressEntry::QNetworkAddressEntry(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QNetworkAddressEntry::~QNetworkAddressEntry(&tmp);
LAB_00219256:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }